

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

int __thiscall ON_Mesh::SolidOrientation(ON_Mesh *this)

{
  int iVar1;
  byte bVar2;
  
  if ((byte)(this->m_mesh_is_solid - 4U) < 0xfd) {
    IsSolid(this);
  }
  bVar2 = this->m_mesh_is_solid - 1;
  iVar1 = 0;
  if (bVar2 < 3) {
    iVar1 = (&DAT_006b6390)[bVar2];
  }
  return iVar1;
}

Assistant:

int ON_Mesh::SolidOrientation() const
{

  if ( m_mesh_is_solid <= 0 || m_mesh_is_solid > 3 )
  {
    // NOTE: calling IsClosed() will set m_mesh_is_solid
    //       to 3 if mes is non-manifold
    if ( IsSolid() )
    {
    }
  }

  switch(m_mesh_is_solid)
  {
  case 1:
    return 1;
    break;

  case 2:
    return -1;
    break;

  case 3:
    return 0;
    break;
  }

  return 0; // answer "no" if we don't know.
}